

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int seal_template_obj(JSContext *ctx,JSValue obj)

{
  int iVar1;
  JSShape *pJVar2;
  uint uVar3;
  JSValueUnion p;
  JSShapeProperty *prs;
  JSShapeProperty *local_10;
  
  p = obj.u;
  pJVar2 = *(JSShape **)((long)p.ptr + 0x18);
  uVar3 = (&(pJVar2->header).ref_count)[(int)(~pJVar2->prop_hash_mask | 0xffffffcf)];
  if (uVar3 == 0) {
    local_10 = (JSShapeProperty *)0x0;
  }
  else {
    pJVar2 = pJVar2 + 1;
    do {
      local_10 = (JSShapeProperty *)((long)pJVar2 + (ulong)uVar3 * 8 + -8);
      if (*(int *)((long)pJVar2 + (ulong)uVar3 * 8 + -4) == 0x30) break;
      uVar3 = *(uint *)local_10 & 0x3ffffff;
      local_10 = (JSShapeProperty *)0x0;
    } while (uVar3 != 0);
  }
  iVar1 = (int)pJVar2;
  if ((local_10 == (JSShapeProperty *)0x0) ||
     (iVar1 = js_update_property_flags
                        (ctx,(JSObject *)p.ptr,&local_10,*(uint *)local_10 >> 0x1a & 0xfffffffc),
     iVar1 == 0)) {
    *(byte *)((long)p.ptr + 5) = *(byte *)((long)p.ptr + 5) & 0xfe;
  }
  return iVar1;
}

Assistant:

static int seal_template_obj(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;
    JSShapeProperty *prs;

    p = JS_VALUE_GET_OBJ(obj);
    prs = find_own_property1(p, JS_ATOM_length);
    if (prs) {
        if (js_update_property_flags(ctx, p, &prs,
                                     prs->flags & ~(JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)))
            return -1;
    }
    p->extensible = FALSE;
    return 0;
}